

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

void __thiscall
CPP::WriteInitialization::LayoutDefaultHandler::writeProperty
          (LayoutDefaultHandler *this,int p,QString *indent,QString *objectName,
          DomPropertyMap *properties,QString *propertyName,QString *setter,int defaultStyleValue,
          bool suppressDefault,QTextStream *str)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  DomProperty *this_00;
  QString *in_RCX;
  QTextStream *in_RDX;
  int in_ESI;
  QString *in_RDI;
  QString *in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  bool bVar4;
  QString *in_stack_00000008;
  int in_stack_00000010;
  byte in_stack_00000018;
  QTextStream *in_stack_00000020;
  bool ifndefMac;
  bool useLayoutFunctionPre43;
  int value;
  DomProperty *prop;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  QString *in_stack_ffffffffffffff70;
  QString *in_stack_ffffffffffffff78;
  QString *in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  undefined7 in_stack_ffffffffffffffa8;
  int value_00;
  
  value_00 = (int)((ulong)in_R9 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_stack_00000018 & 1;
  this_00 = QHash<QString,_DomProperty_*>::value
                      ((QHash<QString,_DomProperty_*> *)in_stack_ffffffffffffff78,
                       in_stack_ffffffffffffff70);
  if (this_00 != (DomProperty *)0x0) {
    iVar3 = DomProperty::elementNumber(this_00);
    in_stack_ffffffffffffff8f = false;
    if (((bVar2 & 1) == 0) &&
       (in_stack_ffffffffffffff8f = false, *(int *)((long)&(in_RDI->d).d + (long)in_ESI * 4) == 3))
    {
      in_stack_ffffffffffffff8f = iVar3 == *(int *)((long)&(in_RDI->d).ptr + (long)in_ESI * 4);
    }
    if ((bool)in_stack_ffffffffffffff8f == false) {
      bVar4 = (*(uint *)((long)&(in_RDI->d).d + (long)in_ESI * 4) & 3) == 0;
      if (bVar4 && iVar3 == in_stack_00000010) {
        QTextStream::operator<<(in_stack_00000020,"#ifndef Q_OS_MAC\n");
      }
      if (in_ESI == 0) {
        writeContentsMargins
                  (in_RCX,in_R8,value_00,(QTextStream *)CONCAT17(bVar2,in_stack_ffffffffffffffa8));
      }
      else {
        anon_unknown.dwarf_90803::writeSetter<int>
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                   in_stack_ffffffffffffff6c,(QTextStream *)0x128fe0);
      }
      if (bVar4 && iVar3 == in_stack_00000010) {
        QTextStream::operator<<(in_stack_00000020,"#endif\n");
      }
      goto LAB_00129102;
    }
  }
  if ((bVar2 & 1) == 0) {
    if ((*(uint *)((long)&(in_RDI->d).d + (long)in_ESI * 4) & 2) == 0) {
      if ((*(uint *)((long)&(in_RDI->d).d + (long)in_ESI * 4) & 1) != 0) {
        if (in_ESI == 0) {
          writeContentsMargins
                    (in_RCX,in_R8,value_00,(QTextStream *)CONCAT17(bVar2,in_stack_ffffffffffffffa8))
          ;
        }
        else {
          anon_unknown.dwarf_90803::writeSetter<int>
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                     in_stack_ffffffffffffff6c,(QTextStream *)0x129100);
        }
      }
    }
    else {
      QString::QString((QString *)in_RDX,
                       (QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      anon_unknown.dwarf_90803::writeSetter<QString>
                (in_RDI,(QString *)
                        CONCAT17(in_stack_ffffffffffffff8f,
                                 CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)),
                 in_stack_00000008,in_RCX,in_RDX);
      QString::~QString((QString *)0x12908e);
    }
  }
LAB_00129102:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::LayoutDefaultHandler::writeProperty(int p, const QString &indent, const QString &objectName,
                                                              const DomPropertyMap &properties, const QString &propertyName, const QString &setter,
                                                              int defaultStyleValue, bool suppressDefault, QTextStream &str) const
{
    // User value
    if (const DomProperty *prop = properties.value(propertyName)) {
        const int value = prop->elementNumber();
        // Emulate the pre 4.3 behaviour: The value form default value was only used to determine
        // the default value, layout properties were always written
        const bool useLayoutFunctionPre43 = !suppressDefault && (m_state[p] == (HasDefaultFunction|HasDefaultValue)) && value == m_defaultValues[p];
        if (!useLayoutFunctionPre43) {
            bool ifndefMac = (!(m_state[p] & (HasDefaultFunction|HasDefaultValue))
                             && value == defaultStyleValue);
            if (ifndefMac)
                str << "#ifndef Q_OS_MAC\n";
            if (p == Margin) { // Use setContentsMargins for numeric values
                writeContentsMargins(indent, objectName, value, str);
            } else {
                writeSetter(indent, objectName, setter, value, str);
            }
            if (ifndefMac)
                str << "#endif\n";
            return;
        }
    }
    if (suppressDefault)
        return;
    // get default.
    if (m_state[p] & HasDefaultFunction) {
        // Do not use setContentsMargins to avoid repetitive evaluations.
        writeSetter(indent, objectName, setter, m_functions[p], str);
        return;
    }
    if (m_state[p] & HasDefaultValue) {
        if (p == Margin) { // Use setContentsMargins for numeric values
            writeContentsMargins(indent, objectName, m_defaultValues[p], str);
        } else {
            writeSetter(indent, objectName, setter, m_defaultValues[p], str);
        }
    }
}